

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O0

void print_state(void *data)

{
  bool bVar1;
  char *pcVar2;
  int local_20;
  int i;
  int have;
  match_state_t *m;
  void *data_local;
  
  bVar1 = false;
  pcVar2 = "";
  if (*(char *)((long)data + 1) != '\0') {
    pcVar2 = " !";
  }
  printf("%s --state",pcVar2);
  local_20 = 0;
  while (m_state[local_20].k != (char *)0x0) {
    if (((uint)*data & m_state[local_20].v) != 0) {
      if (bVar1) {
        printf(",");
      }
      else {
        printf(" ");
      }
      printf("%s",m_state[local_20].k);
      bVar1 = true;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void print_state(void *data)
{
	match_state_t *m = (match_state_t *)data;
	int have = 0;

	printf("%s --state", m->invert ? " !" : "");

	for (int i = 0; m_state[i].k != NULL; i++) {
		if (m->state & m_state[i].v) {
			if (have) {
				printf(",");
			} else {
				printf(" ");
			}

			printf("%s", m_state[i].k);
			have = 1;
		}
	}
}